

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O0

void ss_insertionsort(sauchar_t *T,saidx_t *PA,saidx_t *first,saidx_t *last,saidx_t depth)

{
  uint uVar1;
  saint_t sVar2;
  uint *in_RCX;
  uint *in_RDX;
  long in_RSI;
  sauchar_t *in_RDI;
  saidx_t in_R8D;
  bool bVar3;
  saint_t r;
  saidx_t t;
  saidx_t *j;
  saidx_t *i;
  uint *local_38;
  uint *local_30;
  
  local_30 = in_RCX + -2;
  do {
    if (local_30 < in_RDX) {
      return;
    }
    uVar1 = *local_30;
    local_38 = local_30 + 1;
    do {
      sVar2 = ss_compare(in_RDI,(saidx_t *)(in_RSI + (long)(int)uVar1 * 4),
                         (saidx_t *)(in_RSI + (long)(int)*local_38 * 4),in_R8D);
      if (sVar2 < 1) break;
      do {
        local_38[-1] = *local_38;
        local_38 = local_38 + 1;
        bVar3 = false;
        if (local_38 < in_RCX) {
          bVar3 = (int)*local_38 < 0;
        }
      } while (bVar3);
    } while (local_38 < in_RCX);
    if (sVar2 == 0) {
      *local_38 = *local_38 ^ 0xffffffff;
    }
    local_38[-1] = uVar1;
    local_30 = local_30 + -1;
  } while( true );
}

Assistant:

static
void
ss_insertionsort(const sauchar_t *T, const saidx_t *PA,
                 saidx_t *first, saidx_t *last, saidx_t depth) {
  saidx_t *i, *j;
  saidx_t t;
  saint_t r;

  for(i = last - 2; first <= i; --i) {
    for(t = *i, j = i + 1; 0 < (r = ss_compare(T, PA + t, PA + *j, depth));) {
      do { *(j - 1) = *j; } while((++j < last) && (*j < 0));
      if(last <= j) { break; }
    }
    if(r == 0) { *j = ~*j; }
    *(j - 1) = t;
  }
}